

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdb.c
# Opt level: O0

int mdb_env_open(MDB_env *env,char *path,uint flags,mdb_mode_t mode)

{
  int iVar1;
  size_t sVar2;
  char *__s;
  MDB_IDL pMVar3;
  char *pcVar4;
  void *pvVar5;
  int *piVar6;
  int size;
  int tsize;
  MDB_txn *txn;
  char *dpath;
  char *lpath;
  int excl;
  int len;
  int rc;
  int oflags;
  mdb_mode_t mode_local;
  uint flags_local;
  char *path_local;
  MDB_env *env_local;
  
  lpath._0_4_ = -1;
  if ((env->me_fd != -1) || ((flags & 0xfe00bffe) != 0)) {
    return 0x16;
  }
  rc = mode;
  oflags = flags;
  _mode_local = path;
  path_local = (char *)env;
  sVar2 = strlen(path);
  lpath._4_4_ = (int)sVar2;
  if ((oflags & 0x4000U) == 0) {
    excl = lpath._4_4_ * 2 + 0x14;
  }
  else {
    excl = lpath._4_4_ * 2 + 7;
  }
  __s = (char *)malloc((long)excl);
  if (__s == (char *)0x0) {
    return 0xc;
  }
  if ((oflags & 0x4000U) == 0) {
    txn = (MDB_txn *)(__s + (long)lpath._4_4_ + 10);
    sprintf(__s,"%s/lock.mdb",_mode_local);
    sprintf((char *)txn,"%s/data.mdb",_mode_local);
  }
  else {
    txn = (MDB_txn *)(__s + (long)lpath._4_4_ + 6);
    sprintf(__s,"%s-lock",_mode_local);
    strcpy((char *)txn,_mode_local);
  }
  excl = 0;
  oflags = *(uint *)(path_local + 0xc) | oflags;
  if ((oflags & 0x20000U) == 0) {
    pMVar3 = mdb_midl_alloc(0x1ffff);
    *(MDB_IDL *)(path_local + 200) = pMVar3;
    if (pMVar3 != (MDB_IDL)0x0) {
      pvVar5 = calloc(0x20000,0x10);
      *(void **)(path_local + 0xd0) = pvVar5;
      if (pvVar5 != (void *)0x0) goto LAB_0011738c;
    }
    excl = 0xc;
  }
  else {
    oflags = oflags & 0xfff7ffff;
  }
LAB_0011738c:
  oflags = oflags | 0x20000000;
  *(int *)(path_local + 0xc) = oflags;
  if (excl == 0) {
    pcVar4 = strdup(_mode_local);
    *(char **)(path_local + 0x30) = pcVar4;
    pvVar5 = calloc((ulong)*(uint *)(path_local + 0x24),0x30);
    *(void **)(path_local + 0x88) = pvVar5;
    pvVar5 = calloc((ulong)*(uint *)(path_local + 0x24),2);
    *(void **)(path_local + 0x90) = pvVar5;
    pvVar5 = calloc((ulong)*(uint *)(path_local + 0x24),4);
    *(void **)(path_local + 0x98) = pvVar5;
    if ((((*(long *)(path_local + 0x88) == 0) || (*(long *)(path_local + 0x30) == 0)) ||
        (*(long *)(path_local + 0x90) == 0)) || (*(long *)(path_local + 0x98) == 0)) {
      excl = 0xc;
    }
    else {
      *(code **)(*(long *)(path_local + 0x88) + 0x10) = mdb_cmp_long;
      if ((oflags & 0x420000U) == 0) {
        excl = mdb_env_setup_locks((MDB_env *)path_local,__s,rc,(int *)&lpath);
        if (excl != 0) goto LAB_001176e4;
        excl = 0;
      }
      if ((oflags & 0x20000U) == 0x20000) {
        len = 0;
      }
      else {
        len = 0x42;
      }
      iVar1 = open((char *)txn,len,(ulong)(uint)rc);
      *(int *)path_local = iVar1;
      if (*(int *)path_local == -1) {
        piVar6 = __errno_location();
        excl = *piVar6;
      }
      else {
        if ((oflags & 0x420000U) == 0x20000) {
          excl = mdb_env_setup_locks((MDB_env *)path_local,__s,rc,(int *)&lpath);
          if (excl != 0) goto LAB_001176e4;
          excl = 0;
        }
        excl = mdb_env_open2((MDB_env *)path_local);
        if (excl == 0) {
          if ((oflags & 0xa0000U) == 0) {
            len = len & 0xffffffbf;
            iVar1 = open((char *)txn,len | 0x1000,(ulong)(uint)rc);
            *(int *)(path_local + 8) = iVar1;
            if (*(int *)(path_local + 8) == -1) {
              piVar6 = __errno_location();
              excl = *piVar6;
              goto LAB_001176e4;
            }
          }
          else {
            *(undefined4 *)(path_local + 8) = *(undefined4 *)path_local;
          }
          if ((((int)lpath < 1) ||
              (excl = mdb_env_share_locks((MDB_env *)path_local,(int *)&lpath), excl == 0)) &&
             ((oflags & 0x20000U) == 0)) {
            iVar1 = *(int *)(path_local + 0x24);
            pvVar5 = calloc(1,(ulong)*(uint *)(path_local + 0x10));
            *(void **)(path_local + 0x58) = pvVar5;
            if ((pvVar5 == (void *)0x0) ||
               (pvVar5 = calloc(1,(long)(iVar1 * 0x3d + 0x88)), pvVar5 == (void *)0x0)) {
              excl = 0xc;
            }
            else {
              *(long *)((long)pvVar5 + 0x58) = (long)pvVar5 + 0x88;
              *(ulong *)((long)pvVar5 + 0x68) =
                   *(long *)((long)pvVar5 + 0x58) + (ulong)*(uint *)(path_local + 0x24) * 0x30;
              *(ulong *)((long)pvVar5 + 0x60) =
                   *(long *)((long)pvVar5 + 0x68) + (ulong)*(uint *)(path_local + 0x24) * 8;
              *(ulong *)((long)pvVar5 + 0x70) =
                   *(long *)((long)pvVar5 + 0x60) + (ulong)*(uint *)(path_local + 0x24) * 4;
              *(char **)((long)pvVar5 + 0x20) = path_local;
              *(undefined8 *)((long)pvVar5 + 0x50) = *(undefined8 *)(path_local + 0x88);
              *(undefined4 *)((long)pvVar5 + 0x7c) = 1;
              *(void **)(path_local + 0x68) = pvVar5;
            }
          }
        }
      }
    }
  }
LAB_001176e4:
  if (excl != 0) {
    mdb_env_close1((MDB_env *)path_local);
  }
  free(__s);
  return excl;
}

Assistant:

int ESECT
mdb_env_open(MDB_env *env, const char *path, unsigned int flags, mdb_mode_t mode)
{
	int		oflags, rc, len, excl = -1;
	char *lpath, *dpath;
#ifdef _WIN32
	wchar_t *wpath;
#endif

	if (env->me_fd!=INVALID_HANDLE_VALUE || (flags & ~(CHANGEABLE|CHANGELESS)))
		return EINVAL;

#ifdef MDB_VL32
	if (flags & MDB_WRITEMAP) {
		/* silently ignore WRITEMAP in 32 bit mode */
		flags ^= MDB_WRITEMAP;
	}
	if (flags & MDB_FIXEDMAP) {
		/* cannot support FIXEDMAP */
		return EINVAL;
	}
#endif

	len = strlen(path);
	if (flags & MDB_NOSUBDIR) {
		rc = len + sizeof(LOCKSUFF) + len + 1;
	} else {
		rc = len + sizeof(LOCKNAME) + len + sizeof(DATANAME);
	}
	lpath = malloc(rc);
	if (!lpath)
		return ENOMEM;
	if (flags & MDB_NOSUBDIR) {
		dpath = lpath + len + sizeof(LOCKSUFF);
		sprintf(lpath, "%s" LOCKSUFF, path);
		strcpy(dpath, path);
	} else {
		dpath = lpath + len + sizeof(LOCKNAME);
		sprintf(lpath, "%s" LOCKNAME, path);
		sprintf(dpath, "%s" DATANAME, path);
	}

	rc = MDB_SUCCESS;
	flags |= env->me_flags;
	if (flags & MDB_RDONLY) {
		/* silently ignore WRITEMAP when we're only getting read access */
		flags &= ~MDB_WRITEMAP;
	} else {
		if (!((env->me_free_pgs = mdb_midl_alloc(MDB_IDL_UM_MAX)) &&
			  (env->me_dirty_list = calloc(MDB_IDL_UM_SIZE, sizeof(MDB_ID2)))))
			rc = ENOMEM;
	}
#ifdef MDB_VL32
	if (!rc) {
		env->me_rpages = malloc(MDB_ERPAGE_SIZE * sizeof(MDB_ID3));
		if (!env->me_rpages) {
			rc = ENOMEM;
			goto leave;
		}
		env->me_rpages[0].mid = 0;
		env->me_rpcheck = MDB_ERPAGE_SIZE/2;
	}
#endif
	env->me_flags = flags |= MDB_ENV_ACTIVE;
	if (rc)
		goto leave;

	env->me_path = strdup(path);
	env->me_dbxs = calloc(env->me_maxdbs, sizeof(MDB_dbx));
	env->me_dbflags = calloc(env->me_maxdbs, sizeof(uint16_t));
	env->me_dbiseqs = calloc(env->me_maxdbs, sizeof(unsigned int));
	if (!(env->me_dbxs && env->me_path && env->me_dbflags && env->me_dbiseqs)) {
		rc = ENOMEM;
		goto leave;
	}
	env->me_dbxs[FREE_DBI].md_cmp = mdb_cmp_long; /* aligned MDB_INTEGERKEY */

	/* For RDONLY, get lockfile after we know datafile exists */
	if (!(flags & (MDB_RDONLY|MDB_NOLOCK))) {
		rc = mdb_env_setup_locks(env, lpath, mode, &excl);
		if (rc)
			goto leave;
	}

#ifdef _WIN32
	if (F_ISSET(flags, MDB_RDONLY)) {
		oflags = GENERIC_READ;
		len = OPEN_EXISTING;
	} else {
		oflags = GENERIC_READ|GENERIC_WRITE;
		len = OPEN_ALWAYS;
	}
	mode = FILE_ATTRIBUTE_NORMAL;
	rc = utf8_to_utf16(dpath, -1, &wpath, NULL);
	if (rc)
		goto leave;
	env->me_fd = CreateFileW(wpath, oflags, FILE_SHARE_READ|FILE_SHARE_WRITE,
		NULL, len, mode, NULL);
	free(wpath);
#else
	if (F_ISSET(flags, MDB_RDONLY))
		oflags = O_RDONLY;
	else
		oflags = O_RDWR | O_CREAT;

	env->me_fd = open(dpath, oflags, mode);
#endif
	if (env->me_fd == INVALID_HANDLE_VALUE) {
		rc = ErrCode();
		goto leave;
	}

	if ((flags & (MDB_RDONLY|MDB_NOLOCK)) == MDB_RDONLY) {
		rc = mdb_env_setup_locks(env, lpath, mode, &excl);
		if (rc)
			goto leave;
	}

	if ((rc = mdb_env_open2(env)) == MDB_SUCCESS) {
		if (flags & (MDB_RDONLY|MDB_WRITEMAP)) {
			env->me_mfd = env->me_fd;
		} else {
			/* Synchronous fd for meta writes. Needed even with
			 * MDB_NOSYNC/MDB_NOMETASYNC, in case these get reset.
			 */
#ifdef _WIN32
			len = OPEN_EXISTING;
			rc = utf8_to_utf16(dpath, -1, &wpath, NULL);
			if (rc)
				goto leave;
			env->me_mfd = CreateFileW(wpath, oflags,
				FILE_SHARE_READ|FILE_SHARE_WRITE, NULL, len,
				mode | FILE_FLAG_WRITE_THROUGH, NULL);
			free(wpath);
#else
			oflags &= ~O_CREAT;
			env->me_mfd = open(dpath, oflags | MDB_DSYNC, mode);
#endif
			if (env->me_mfd == INVALID_HANDLE_VALUE) {
				rc = ErrCode();
				goto leave;
			}
		}
		DPRINTF(("opened dbenv %p", (void *) env));
		if (excl > 0) {
			rc = mdb_env_share_locks(env, &excl);
			if (rc)
				goto leave;
		}
		if (!(flags & MDB_RDONLY)) {
			MDB_txn *txn;
			int tsize = sizeof(MDB_txn), size = tsize + env->me_maxdbs *
				(sizeof(MDB_db)+sizeof(MDB_cursor *)+sizeof(unsigned int)+1);
			if ((env->me_pbuf = calloc(1, env->me_psize)) &&
				(txn = calloc(1, size)))
			{
				txn->mt_dbs = (MDB_db *)((char *)txn + tsize);
				txn->mt_cursors = (MDB_cursor **)(txn->mt_dbs + env->me_maxdbs);
				txn->mt_dbiseqs = (unsigned int *)(txn->mt_cursors + env->me_maxdbs);
				txn->mt_dbflags = (unsigned char *)(txn->mt_dbiseqs + env->me_maxdbs);
				txn->mt_env = env;
#ifdef MDB_VL32
				txn->mt_rpages = malloc(MDB_TRPAGE_SIZE * sizeof(MDB_ID3));
				if (!txn->mt_rpages) {
					free(txn);
					rc = ENOMEM;
					goto leave;
				}
				txn->mt_rpages[0].mid = 0;
				txn->mt_rpcheck = MDB_TRPAGE_SIZE/2;
#endif
				txn->mt_dbxs = env->me_dbxs;
				txn->mt_flags = MDB_TXN_FINISHED;
				env->me_txn0 = txn;
			} else {
				rc = ENOMEM;
			}
		}
	}

leave:
	if (rc) {
		mdb_env_close0(env, excl);
	}
	free(lpath);
	return rc;
}